

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.h
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::FunctionCreationContext::computeTypeLocals
          (FunctionCreationContext *this)

{
  iterator __position;
  long lVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  ulong uVar2;
  ulong uVar3;
  key_type local_40;
  uint local_34;
  
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->typeLocals)._M_h);
  local_34 = 0;
  lVar1 = wasm::Function::getNumLocals();
  if (lVar1 != 0) {
    do {
      local_40.id = wasm::Function::getLocalType((uint)this->func);
      this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                std::__detail::
                _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->typeLocals,&local_40);
      __position._M_current = *(uint **)(this_00 + 8);
      if (__position._M_current == *(uint **)(this_00 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_34);
      }
      else {
        *__position._M_current = local_34;
        *(uint **)(this_00 + 8) = __position._M_current + 1;
      }
      local_34 = local_34 + 1;
      uVar3 = (ulong)local_34;
      uVar2 = wasm::Function::getNumLocals();
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

void computeTypeLocals() {
      typeLocals.clear();
      for (Index i = 0; i < func->getNumLocals(); i++) {
        typeLocals[func->getLocalType(i)].push_back(i);
      }
    }